

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O1

string * __thiscall Kernel::Term::headToString_abi_cxx11_(string *__return_storage_ptr__,Term *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  pointer pcVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  Tuples *this_00;
  undefined8 *puVar8;
  TermList TVar9;
  TermList TVar10;
  long lVar11;
  undefined8 *puVar12;
  long *plVar13;
  Symbol *pSVar14;
  OperatorType *pOVar15;
  uint uVar16;
  ulong *puVar17;
  uint *puVar18;
  size_type *psVar19;
  long *plVar20;
  uint i;
  uint extraout_EDX;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar21;
  byte bVar22;
  uint uVar23;
  uint *puVar24;
  _Alloc_hider _Var25;
  uint uVar26;
  ulong uVar27;
  uint proj;
  string typesList;
  string symbolsList;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  TermList lambdaExp;
  TermList binding;
  TermList binding_1;
  string local_1c0;
  string local_1a0;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  string *local_120;
  string local_118;
  TermList local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  TermList local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  TermList local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  switch(this->_functor) {
  case 0xfffffff9:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    *(undefined4 *)&__return_storage_ptr__->field_2 = 0x74616d24;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 3) = 0x28686374;
    __return_storage_ptr__->_M_string_length = 7;
    (__return_storage_ptr__->field_2)._M_local_buf[7] = '\0';
    return __return_storage_ptr__;
  case 0xfffffffa:
    puVar24 = *(uint **)&this[-1]._weight;
    puVar8 = *(undefined8 **)&this[-1]._maxRedLen;
    local_f8._content = *(uint64_t *)&this[-1]._functor;
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    local_180.field_2._M_allocated_capacity._0_2_ = 0x5b;
    local_180._M_string_length = 1;
    local_120 = __return_storage_ptr__;
    if (puVar24 != (uint *)0x0) {
      paVar1 = &local_1a0.field_2;
      bVar5 = true;
      do {
        uVar23 = (uint)in_RDX;
        if (bVar5) {
          bVar5 = false;
        }
        else {
          std::__cxx11::string::append((char *)&local_180);
          uVar23 = extraout_EDX;
        }
        uVar26 = *puVar24;
        puVar24 = *(uint **)(puVar24 + 2);
        variableToString_abi_cxx11_(&local_1c0,(Term *)(ulong)uVar26,uVar23);
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c0);
        puVar17 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar17) {
          local_1a0.field_2._M_allocated_capacity = *puVar17;
          local_1a0.field_2._8_8_ = puVar12[3];
          local_1a0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_1a0.field_2._M_allocated_capacity = *puVar17;
          local_1a0._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_1a0._M_string_length = puVar12[1];
        *puVar12 = puVar17;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_1a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        local_1c0._M_dataplus._M_p = (pointer)*puVar8;
        puVar8 = (undefined8 *)puVar8[1];
        TermList::toString_abi_cxx11_(&local_1a0,(TermList *)&local_1c0,false);
        std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_1a0._M_dataplus._M_p);
        in_RDX = extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          in_RDX = extraout_RDX_00;
        }
      } while (puVar24 != (uint *)0x0);
    }
    std::__cxx11::string::append((char *)&local_180);
    std::operator+(&local_160,"(^",&local_180);
    __return_storage_ptr__ = local_120;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
    paVar1 = &local_1c0.field_2;
    puVar17 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_1c0.field_2._M_allocated_capacity = *puVar17;
      local_1c0.field_2._8_8_ = puVar8[3];
      local_1c0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1c0.field_2._M_allocated_capacity = *puVar17;
      local_1c0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_1c0._M_string_length = puVar8[1];
    *puVar8 = puVar17;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    TermList::toString_abi_cxx11_(&local_140,&local_f8,false);
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != paVar1) {
      uVar21 = local_1c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < local_140._M_string_length + local_1c0._M_string_length) {
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        uVar21 = local_140.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_140._M_string_length + local_1c0._M_string_length)
      goto LAB_005d75b9;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_140,0,(char *)0x0,(ulong)local_1c0._M_dataplus._M_p);
    }
    else {
LAB_005d75b9:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_140._M_dataplus._M_p)
      ;
    }
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    puVar17 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_1a0.field_2._M_allocated_capacity = *puVar17;
      local_1a0.field_2._8_8_ = puVar8[3];
    }
    else {
      local_1a0.field_2._M_allocated_capacity = *puVar17;
      local_1a0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_1a0._M_string_length = puVar8[1];
    *puVar8 = puVar17;
    puVar8[1] = 0;
    *(undefined1 *)puVar17 = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_1a0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar19 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar19) {
      lVar11 = plVar13[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar19;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar11;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar13;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar19;
    }
    __return_storage_ptr__->_M_string_length = plVar13[1];
    *plVar13 = (long)psVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    uVar21 = local_160.field_2._M_allocated_capacity;
    _Var25._M_p = local_160._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p == &local_160.field_2) goto LAB_005d7f8c;
    goto LAB_005d7f7a;
  case 0xfffffffb:
    puVar24 = *(uint **)&this[-1]._weight;
    local_d8._content = *(uint64_t *)&this[-1]._maxRedLen;
    local_120 = __return_storage_ptr__;
    pOVar15 = Signature::Symbol::fnType((DAT_00b7e1b0->_funs)._stack[this[-1]._functor]);
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    uVar26 = 0;
    local_180._M_string_length = 0;
    local_180.field_2._M_allocated_capacity =
         local_180.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    local_1a0._M_string_length = 0;
    local_1a0.field_2._M_allocated_capacity =
         local_1a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    uVar23 = 0;
    while( true ) {
      uVar6 = 0;
      if (puVar24 != (uint *)0x0) {
        uVar6 = 0;
        puVar18 = puVar24;
        do {
          uVar6 = uVar6 + 1;
          puVar18 = *(uint **)(puVar18 + 2);
        } while (puVar18 != (uint *)0x0);
      }
      if (uVar6 <= uVar23) break;
      if (uVar23 < pOVar15->_typeArgsArity) {
        TVar9 = AtomicSort::superSort();
      }
      else {
        TVar9._content =
             *(uint64_t *)(pOVar15->_key + (ulong)(uVar23 - pOVar15->_typeArgsArity) * 8 + 8);
      }
      TVar10 = AtomicSort::boolSort();
      puVar18 = puVar24;
      if (TVar9._content == TVar10._content) {
        lVar11 = 0x80;
        uVar6 = uVar26;
        uVar16 = uVar23;
        while (uVar16 != 0) {
          puVar18 = *(uint **)(puVar18 + 2);
          uVar6 = uVar6 + 1;
          uVar16 = uVar6;
        }
      }
      else {
        lVar11 = 0x60;
        uVar6 = uVar26;
        uVar16 = uVar23;
        while (uVar16 != 0) {
          puVar18 = *(uint **)(puVar18 + 2);
          uVar6 = uVar6 + 1;
          uVar16 = uVar6;
        }
      }
      puVar17 = *(ulong **)
                 (*(long *)((long)&(DAT_00b7e1b0->_dividesNvalues)._capacity + lVar11) +
                 (ulong)*puVar18 * 8);
      std::__cxx11::string::_M_append((char *)&local_180,*puVar17);
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_160,*puVar17,puVar17[1] + *puVar17)
      ;
      std::__cxx11::string::append((char *)&local_160);
      if (uVar23 < pOVar15->_typeArgsArity) {
        local_f8 = AtomicSort::superSort();
      }
      else {
        local_f8._content =
             *(uint64_t *)(pOVar15->_key + (ulong)(uVar23 - pOVar15->_typeArgsArity) * 8 + 8);
      }
      TermList::toString_abi_cxx11_(&local_140,&local_f8,false);
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        uVar21 = local_160.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_140._M_string_length + local_160._M_string_length) {
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          uVar21 = local_140.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_140._M_string_length + local_160._M_string_length)
        goto LAB_005d6cbc;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_140,0,(char *)0x0,(ulong)local_160._M_dataplus._M_p);
      }
      else {
LAB_005d6cbc:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_160,(ulong)local_140._M_dataplus._M_p);
      }
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      puVar17 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_1c0.field_2._M_allocated_capacity = *puVar17;
        local_1c0.field_2._8_8_ = puVar8[3];
      }
      else {
        local_1c0.field_2._M_allocated_capacity = *puVar17;
        local_1c0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_1c0._M_string_length = puVar8[1];
      *puVar8 = puVar17;
      puVar8[1] = 0;
      *(undefined1 *)puVar17 = 0;
      std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_1c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      uVar6 = 0xffffffff;
      for (puVar18 = puVar24; puVar18 != (uint *)0x0; puVar18 = *(uint **)(puVar18 + 2)) {
        uVar6 = uVar6 + 1;
      }
      if (uVar23 != uVar6) {
        std::__cxx11::string::append((char *)&local_180);
        std::__cxx11::string::append((char *)&local_1a0);
      }
      uVar23 = uVar23 + 1;
      uVar26 = uVar26 - 1;
    }
    std::operator+(&local_b8,"$let([",&local_1a0);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_b8);
    __return_storage_ptr__ = local_120;
    paVar1 = &local_160.field_2;
    plVar20 = plVar13 + 2;
    if ((long *)*plVar13 == plVar20) {
      local_e8 = *plVar20;
      lStack_e0 = plVar13[3];
      local_f8._content = (uint64_t)&local_e8;
    }
    else {
      local_e8 = *plVar20;
      local_f8._content = (uint64_t)*plVar13;
    }
    local_f0 = plVar13[1];
    *plVar13 = (long)plVar20;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_f8,(ulong)local_180._M_dataplus._M_p);
    puVar17 = (ulong *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_140.field_2._M_allocated_capacity = *puVar17;
      local_140.field_2._8_8_ = plVar13[3];
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    }
    else {
      local_140.field_2._M_allocated_capacity = *puVar17;
      local_140._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_140._M_string_length = plVar13[1];
    *plVar13 = (long)puVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
    puVar17 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_160.field_2._M_allocated_capacity = *puVar17;
      local_160.field_2._8_8_ = puVar8[3];
      local_160._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_160.field_2._M_allocated_capacity = *puVar17;
      local_160._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_160._M_string_length = puVar8[1];
    *puVar8 = puVar17;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    TermList::toString_abi_cxx11_(&local_118,&local_d8,false);
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      uVar21 = local_160.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < local_118._M_string_length + local_160._M_string_length) {
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        uVar21 = local_118.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_118._M_string_length + local_160._M_string_length)
      goto LAB_005d7709;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_118,0,(char *)0x0,(ulong)local_160._M_dataplus._M_p);
    }
    else {
LAB_005d7709:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_118._M_dataplus._M_p)
      ;
    }
    puVar17 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_1c0.field_2._M_allocated_capacity = *puVar17;
      local_1c0.field_2._8_8_ = puVar8[3];
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    }
    else {
      local_1c0.field_2._M_allocated_capacity = *puVar17;
      local_1c0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_1c0._M_string_length = puVar8[1];
    *puVar8 = puVar17;
    puVar8[1] = 0;
    *(undefined1 *)puVar17 = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_1c0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar19 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar19) {
      lVar11 = plVar13[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar19;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar11;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar13;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar19;
    }
    __return_storage_ptr__->_M_string_length = plVar13[1];
    *plVar13 = (long)psVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_f8._content != &local_e8) {
      operator_delete((void *)local_f8._content,local_e8 + 1);
    }
    local_50.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
LAB_005d7f5e:
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    break;
  case 0xfffffffc:
    lVar11 = *(long *)&this[-1]._functor;
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    local_180._M_string_length = 0;
    local_180.field_2._M_allocated_capacity =
         local_180.field_2._M_allocated_capacity & 0xffffffffffffff00;
    uVar27 = (ulong)(*(uint *)(lVar11 + 0xc) & 0xfffffff);
    local_120 = __return_storage_ptr__;
    if ((*(uint *)(lVar11 + 0x28 + uVar27 * 8) & 3) != 2) {
      do {
        local_1c0._M_dataplus._M_p = *(pointer *)(lVar11 + 0x28 + uVar27 * 8);
        TermList::toString_abi_cxx11_(&local_1a0,(TermList *)&local_1c0,false);
        std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_1a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if ((int)uVar27 != 1) {
          std::__cxx11::string::append((char *)&local_180);
        }
        lVar2 = uVar27 * 8;
        uVar27 = uVar27 - 1;
      } while ((*(uint *)(lVar11 + 0x20 + lVar2) & 3) != 2);
    }
    std::operator+(&local_1a0,"[",&local_180);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_1a0);
    __return_storage_ptr__ = local_120;
    (local_120->_M_dataplus)._M_p = (pointer)&local_120->field_2;
    psVar19 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar19) {
      lVar11 = plVar13[3];
      (local_120->field_2)._M_allocated_capacity = *psVar19;
      *(long *)((long)&local_120->field_2 + 8) = lVar11;
    }
    else {
      (local_120->_M_dataplus)._M_p = (pointer)*plVar13;
      (local_120->field_2)._M_allocated_capacity = *psVar19;
    }
    local_120->_M_string_length = plVar13[1];
    *plVar13 = (long)psVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    uVar21 = local_180.field_2._M_allocated_capacity;
    _Var25._M_p = local_180._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p == &local_180.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_005d7f96;
  case 0xfffffffd:
    Formula::toString_abi_cxx11_(&local_180,*(Formula **)&this[-1]._functor);
    bVar22 = *(byte *)(::Lib::env + 0xa532) | *(byte *)(::Lib::env + 0x913a);
    if ((bVar22 & 1) == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_180._M_dataplus._M_p,
                 local_180._M_dataplus._M_p + local_180._M_string_length);
    }
    else {
      std::operator+(&local_1a0,"$term{",&local_180);
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_1a0);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar19 = (size_type *)(plVar13 + 2);
      if ((size_type *)*plVar13 == psVar19) {
        lVar11 = plVar13[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar19;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar11;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar13;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar19;
      }
      __return_storage_ptr__->_M_string_length = plVar13[1];
      *plVar13 = (long)psVar19;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
    }
    if (((bVar22 & 1) != 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2)) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    goto LAB_005d7f8c;
  case 0xfffffffe:
    local_58._content = *(uint64_t *)&this[-1]._maxRedLen;
    if ((local_58._content & 3) == 0) {
      bVar5 = isBoolean((Term *)local_58._content);
    }
    else {
      bVar5 = false;
    }
    if (bVar5 == false) {
      pSVar14 = (Symbol *)Signature::functionName_abi_cxx11_(DAT_00b7e1b0,this[-1]._functor);
    }
    else {
      pSVar14 = (DAT_00b7e1b0->_preds)._stack[(int)this[-1]._functor];
    }
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    pcVar3 = (pSVar14->_name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_180,pcVar3,pcVar3 + (pSVar14->_name)._M_string_length);
    if (bVar5 == false) {
      local_120 = __return_storage_ptr__;
      pOVar15 = Signature::Symbol::fnType((DAT_00b7e1b0->_funs)._stack[this[-1]._functor]);
      uVar21 = extraout_RDX_02;
    }
    else {
      local_120 = __return_storage_ptr__;
      pOVar15 = Signature::Symbol::predType((DAT_00b7e1b0->_preds)._stack[this[-1]._functor]);
      uVar21 = extraout_RDX_01;
    }
    puVar24 = *(uint **)&this[-1]._weight;
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    local_1a0._M_string_length = 0;
    local_1a0.field_2._M_allocated_capacity =
         local_1a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    uVar23 = 0;
    uVar26 = 0;
    while( true ) {
      __return_storage_ptr__ = local_120;
      uVar6 = 0;
      if (puVar24 != (uint *)0x0) {
        uVar6 = 0;
        puVar18 = puVar24;
        do {
          uVar6 = uVar6 + 1;
          puVar18 = *(uint **)(puVar18 + 2);
        } while (puVar18 != (uint *)0x0);
      }
      puVar18 = puVar24;
      uVar16 = uVar23;
      uVar4 = uVar26;
      if (uVar6 <= uVar26) break;
      while (uVar4 != 0) {
        uVar16 = uVar16 + 1;
        puVar18 = *(uint **)(puVar18 + 2);
        uVar4 = uVar16;
      }
      variableToString_abi_cxx11_(&local_1c0,(Term *)(ulong)*puVar18,(uint)uVar21);
      std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_1c0._M_dataplus._M_p);
      uVar21 = extraout_RDX_03;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        uVar21 = extraout_RDX_04;
      }
      uVar6 = 0xffffffff;
      for (puVar18 = puVar24; puVar18 != (uint *)0x0; puVar18 = *(uint **)(puVar18 + 2)) {
        uVar6 = uVar6 + 1;
      }
      if (uVar26 < uVar6) {
        std::__cxx11::string::append((char *)&local_1a0);
        uVar21 = extraout_RDX_05;
      }
      uVar26 = uVar26 + 1;
      uVar23 = uVar23 - 1;
    }
    if (puVar24 != (uint *)0x0) {
      iVar7 = 0;
      do {
        puVar24 = *(uint **)(puVar24 + 2);
        iVar7 = iVar7 + -1;
      } while (puVar24 != (uint *)0x0);
      if (iVar7 != 0) {
        std::operator+(&local_160,"(",&local_1a0);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
        puVar17 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar17) {
          local_1c0.field_2._M_allocated_capacity = *puVar17;
          local_1c0.field_2._8_8_ = puVar8[3];
          local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        }
        else {
          local_1c0.field_2._M_allocated_capacity = *puVar17;
          local_1c0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_1c0._M_string_length = puVar8[1];
        *puVar8 = puVar17;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_1a0,(string *)&local_1c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
      }
    }
    std::operator+(&local_50,"$let(",&local_180);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_50);
    puVar17 = (ulong *)(plVar13 + 2);
    if ((ulong *)*plVar13 == puVar17) {
      local_c8 = *puVar17;
      lStack_c0 = plVar13[3];
      local_d8._content = (uint64_t)&local_c8;
    }
    else {
      local_c8 = *puVar17;
      local_d8._content = (uint64_t)*plVar13;
    }
    local_d0 = plVar13[1];
    *plVar13 = (long)puVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    OperatorType::toString_abi_cxx11_(&local_78,pOVar15);
    uVar27 = 0xf;
    if ((ulong *)local_d8._content != &local_c8) {
      uVar27 = local_c8;
    }
    if (uVar27 < local_78._M_string_length + local_d0) {
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        uVar21 = local_78.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_78._M_string_length + local_d0) goto LAB_005d7b19;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,local_d8._content);
    }
    else {
LAB_005d7b19:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_78._M_dataplus._M_p);
    }
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    puVar17 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_118.field_2._M_allocated_capacity = *puVar17;
      local_118.field_2._8_8_ = puVar8[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = *puVar17;
      local_118._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_118._M_string_length = puVar8[1];
    *puVar8 = puVar17;
    puVar8[1] = 0;
    *(undefined1 *)puVar17 = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar19 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar19) {
      local_b8.field_2._M_allocated_capacity = *psVar19;
      local_b8.field_2._8_8_ = plVar13[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar19;
      local_b8._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_b8._M_string_length = plVar13[1];
    *plVar13 = (long)psVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_b8,(ulong)local_180._M_dataplus._M_p);
    plVar20 = plVar13 + 2;
    if ((long *)*plVar13 == plVar20) {
      local_e8 = *plVar20;
      lStack_e0 = plVar13[3];
      local_f8._content = (uint64_t)&local_e8;
    }
    else {
      local_e8 = *plVar20;
      local_f8._content = (uint64_t)*plVar13;
    }
    local_f0 = plVar13[1];
    *plVar13 = (long)plVar20;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_f8,(ulong)local_1a0._M_dataplus._M_p);
    puVar17 = (ulong *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_140.field_2._M_allocated_capacity = *puVar17;
      local_140.field_2._8_8_ = plVar13[3];
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    }
    else {
      local_140.field_2._M_allocated_capacity = *puVar17;
      local_140._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_140._M_string_length = plVar13[1];
    *plVar13 = (long)puVar17;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
    paVar1 = &local_160.field_2;
    puVar17 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_160.field_2._M_allocated_capacity = *puVar17;
      local_160.field_2._8_8_ = puVar8[3];
      local_160._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_160.field_2._M_allocated_capacity = *puVar17;
      local_160._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_160._M_string_length = puVar8[1];
    *puVar8 = puVar17;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    TermList::toString_abi_cxx11_(&local_98,&local_58,false);
    uVar21 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      uVar21 = local_160.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar21 < local_98._M_string_length + local_160._M_string_length) {
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        uVar21 = local_98.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_98._M_string_length + local_160._M_string_length) goto LAB_005d7d7c;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_98,0,(char *)0x0,(ulong)local_160._M_dataplus._M_p);
    }
    else {
LAB_005d7d7c:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_98._M_dataplus._M_p);
    }
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    puVar17 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_1c0.field_2._M_allocated_capacity = *puVar17;
      local_1c0.field_2._8_8_ = puVar8[3];
    }
    else {
      local_1c0.field_2._M_allocated_capacity = *puVar17;
      local_1c0._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_1c0._M_string_length = puVar8[1];
    *puVar8 = puVar17;
    puVar8[1] = 0;
    *(undefined1 *)puVar17 = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_1c0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar19 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar19) {
      lVar11 = plVar13[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar19;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar11;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar13;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar19;
    }
    __return_storage_ptr__->_M_string_length = plVar13[1];
    *plVar13 = (long)psVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_f8._content != &local_e8) {
      operator_delete((void *)local_f8._content,local_e8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((ulong *)local_d8._content != &local_c8) {
      operator_delete((void *)local_d8._content,local_c8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_005d7f5e;
    break;
  case 0xffffffff:
    Formula::toString_abi_cxx11_(&local_1a0,*(Formula **)&this[-1]._functor);
    puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x91cee9);
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    puVar17 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_180.field_2._M_allocated_capacity = *puVar17;
      local_180.field_2._8_8_ = puVar8[3];
    }
    else {
      local_180.field_2._M_allocated_capacity = *puVar17;
      local_180._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_180._M_string_length = puVar8[1];
    *puVar8 = puVar17;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_180);
LAB_005d7472:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar19 = (size_type *)(plVar13 + 2);
    if ((size_type *)*plVar13 == psVar19) {
      lVar11 = plVar13[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar19;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar11;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar13;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar19;
    }
    __return_storage_ptr__->_M_string_length = plVar13[1];
    *plVar13 = (long)psVar19;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    uVar21 = local_1a0.field_2._M_allocated_capacity;
    _Var25._M_p = local_1a0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p == &local_1a0.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_005d7f96;
  default:
    if ((this->_args[0]._content & 0x20) == 0) {
      this_00 = Theory::tuples();
      bVar5 = Theory::Tuples::findProjection
                        (this_00,this->_functor,SUB41(((uint)this->_args[0]._content & 0x10) >> 4,0)
                         ,(uint *)&local_1c0);
      if (bVar5) {
        ::Lib::Int::toString_abi_cxx11_
                  (&local_1a0,(Int *)((ulong)local_1c0._M_dataplus._M_p & 0xffffffff),i);
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x91cf0c);
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        puVar17 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar17) {
          local_180.field_2._M_allocated_capacity = *puVar17;
          local_180.field_2._8_8_ = puVar8[3];
        }
        else {
          local_180.field_2._M_allocated_capacity = *puVar17;
          local_180._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_180._M_string_length = puVar8[1];
        *puVar8 = puVar17;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        plVar13 = (long *)std::__cxx11::string::append((char *)&local_180);
        goto LAB_005d7472;
      }
    }
    uVar27 = this->_args[0]._content;
    paVar1 = &local_180.field_2;
    local_180._M_string_length = 0;
    local_180.field_2._M_allocated_capacity =
         local_180.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_180._M_dataplus._M_p = (pointer)paVar1;
    if ((uVar27 & 0x10) == 0) {
      if ((uVar27 & 0x20) == 0) {
        Signature::functionName_abi_cxx11_(DAT_00b7e1b0,this->_functor);
        goto LAB_005d6a73;
      }
      if ((this->_functor == 1 & (*(byte *)(::Lib::env + 0xa532) | *(byte *)(::Lib::env + 0x913a)))
          == 1) {
        std::__cxx11::string::_M_replace((ulong)&local_180,0,(char *)0x0,0x91cf13);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_180);
      }
    }
    else {
LAB_005d6a73:
      std::__cxx11::string::_M_assign((string *)&local_180);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_180._M_dataplus._M_p,
               local_180._M_dataplus._M_p + local_180._M_string_length);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar21 = local_180.field_2._M_allocated_capacity;
    _Var25._M_p = local_180._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p == paVar1) {
      return __return_storage_ptr__;
    }
    goto LAB_005d7f96;
  }
  uVar21 = local_1a0.field_2._M_allocated_capacity;
  _Var25._M_p = local_1a0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
LAB_005d7f7a:
    operator_delete(_Var25._M_p,uVar21 + 1);
  }
LAB_005d7f8c:
  uVar21 = local_180.field_2._M_allocated_capacity;
  _Var25._M_p = local_180._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p == &local_180.field_2) {
    return __return_storage_ptr__;
  }
LAB_005d7f96:
  operator_delete(_Var25._M_p,uVar21 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string Term::headToString() const
{
  if (isSpecial()) {
    const Term::SpecialTermData* sd = getSpecialData();

    switch(specialFunctor()) {
      case SpecialFunctor::FORMULA: {
        ASS_EQ(arity(), 0);
        std::string formula = sd->getFormula()->toString();
        return env.options->showFOOL() ? "$term{" + formula + "}" : formula;
      }
      case SpecialFunctor::LET: {
        ASS_EQ(arity(), 1);
        TermList binding = sd->getBinding();
        bool isPredicate = binding.isTerm() && binding.term()->isBoolean();
        std::string functor = isPredicate ? env.signature->predicateName(sd->getFunctor())
                                      : env.signature->functionName(sd->getFunctor());
        OperatorType* type = isPredicate ? env.signature->getPredicate(sd->getFunctor())->predType()
                                         : env.signature->getFunction(sd->getFunctor())->fnType();

        const VList* variables = sd->getVariables();
        std::string variablesList = "";
        for (unsigned i = 0; i < VList::length(variables); i++) {
          unsigned var = VList::nth(variables, i);
          variablesList += Term::variableToString(var);
          if (i < VList::length(variables) - 1) {
            variablesList += ", ";
          }
        }
        if (VList::length(variables)) {
          variablesList = "(" + variablesList + ")";
        }
        return "$let(" + functor + ": " + type->toString() + ", " + functor + variablesList + " := " + binding.toString() + ", ";
      }
      case SpecialFunctor::ITE: {
        ASS_EQ(arity(),2);
        return "$ite(" + sd->getCondition()->toString() + ", ";
      }
      case SpecialFunctor::TUPLE: {
        ASS_EQ(arity(), 0);
        Term* term = sd->getTupleTerm();
        std::string termList = "";
        Term::Iterator tit(term);
        unsigned i = term->arity();
        while (tit.hasNext()) {
          termList += tit.next().toString();
          if (--i > 0) {
            termList += ", ";
          }
        }
        return "[" + termList + "]";
      }
      case SpecialFunctor::LET_TUPLE: {
        ASS_EQ(arity(), 1);
        VList* symbols = sd->getTupleSymbols();
        unsigned tupleFunctor = sd->getFunctor();
        TermList binding = sd->getBinding();

        OperatorType* fnType = env.signature->getFunction(tupleFunctor)->fnType();

        std::string symbolsList = "";
        std::string typesList = "";
        for (unsigned i = 0; i < VList::length(symbols); i++) {
          Signature::Symbol* symbol = (fnType->arg(i) == AtomicSort::boolSort())
            ? env.signature->getPredicate(VList::nth(symbols, i))
            : env.signature->getFunction(VList::nth(symbols, i));
          symbolsList += symbol->name();
          typesList += symbol->name() + ": " + fnType->arg(i).toString();
          if (i != VList::length(symbols) - 1) {
            symbolsList += ", ";
            typesList += ", ";
          }
        }

        return "$let([" + typesList + "], [" + symbolsList + "] := " + binding.toString() + ", ";
      }
      case SpecialFunctor::LAMBDA: {
        VList* vars = sd->getLambdaVars();
        SList* sorts = sd->getLambdaVarSorts();
        TermList lambdaExp = sd->getLambdaExp();

        std::string varList = "[";

        VList::Iterator vs(vars);
        SList::Iterator ss(sorts);
        bool first = true;
        while(vs.hasNext()) {
          if (!first){
            varList += ", ";
          }else{ first = false; }
          varList += Term::variableToString(vs.next()) + " : ";
          varList += ss.next().toString();
        }
        varList += "]";
        return "(^" + varList + " : (" + lambdaExp.toString() + "))";
      }
      case SpecialFunctor::MATCH: {
        // we simply let the arguments be written out
        return "$match(";
      }
      default:
        ASSERTION_VIOLATION;
    }
  } else {
    unsigned proj;
    if (!isSort() && Theory::tuples()->findProjection(functor(), isLiteral(), proj)) {
      return "$proj(" + Int::toString(proj) + ", ";
    }
    bool print = (isLiteral() || isSort() ||
                 (env.signature->getFunction(_functor)->combinator() == Signature::NOT_COMB)) && arity();
    std::string name = "";
    if(isLiteral()) {
      name = static_cast<const Literal *>(this)->predicateName();
    } else if (isSort()) {
      const AtomicSort* asSort = static_cast<const AtomicSort *>(this);
      if(env.options->showFOOL() && asSort->isBoolSort()){
        name = "$bool";
      } else {
        name = asSort->typeConName();
      }
    } else {
      name = functionName();
    }
    return name + (print ? "(" : "");
  }
}